

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O1

int bam_write1(BGZF *fp,bam1_t *b)

{
  uint uVar1;
  undefined8 uVar2;
  uint uVar3;
  int iVar4;
  ssize_t sVar5;
  long lVar6;
  uint uVar7;
  byte bVar8;
  uint32_t block_len;
  uint32_t y;
  uint32_t x [8];
  uint local_50;
  uint local_4c;
  uint local_48 [10];
  
  local_50 = b->l_data + 0x20;
  local_48[0] = (b->core).tid;
  local_48[1] = (b->core).pos;
  uVar2 = *(undefined8 *)&(b->core).field_0x8;
  local_48[2] = (uint)((ulong)uVar2 >> 0x18) & 0xff |
                (uint)((ulong)uVar2 >> 8) & 0xff00 | (int)uVar2 << 0x10;
  local_48[3] = (uint)(ushort)((ulong)uVar2 >> 0x30) | (uint)((ulong)uVar2 >> 0x10) & 0xffff0000;
  local_48[4] = (b->core).l_qseq;
  local_48[5] = (b->core).mtid;
  local_48[6] = (b->core).mpos;
  local_48[7] = (b->core).isize;
  uVar3 = bgzf_flush_try(fp,(ulong)(b->l_data + 0x24));
  uVar7 = ~uVar3 >> 0x1f;
  if ((fp->field_0x2 & 0xc) == 0) {
    if (-1 < (int)uVar3) {
      sVar5 = bgzf_write(fp,&local_50,4);
      uVar7 = (uint)(-1 < sVar5);
    }
  }
  else {
    lVar6 = 0;
    do {
      uVar1 = local_48[lVar6];
      local_48[lVar6] =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 8);
    local_4c = local_50;
    if (-1 < (int)uVar3) {
      local_4c = local_50 >> 0x18 | (local_50 & 0xff0000) >> 8 | (local_50 & 0xff00) << 8 |
                 local_50 << 0x18;
      sVar5 = bgzf_write(fp,&local_4c,4);
      uVar7 = (uint)(-1 < sVar5);
    }
    swap_data(&b->core,b->l_data,b->data,1);
  }
  bVar8 = 1;
  if (uVar7 != 0) {
    sVar5 = bgzf_write(fp,local_48,0x20);
    if (-1 < sVar5) {
      sVar5 = bgzf_write(fp,b->data,(long)b->l_data);
      bVar8 = (byte)((ulong)sVar5 >> 0x3f);
    }
  }
  if ((fp->field_0x2 & 0xc) != 0) {
    swap_data(&b->core,b->l_data,b->data,0);
  }
  iVar4 = -1;
  if (bVar8 == 0) {
    iVar4 = local_50 + 4;
  }
  return iVar4;
}

Assistant:

int bam_write1(BGZF *fp, const bam1_t *b)
{
    const bam1_core_t *c = &b->core;
    uint32_t x[8], block_len = b->l_data + 32, y;
    int i, ok;
    x[0] = c->tid;
    x[1] = c->pos;
    x[2] = (uint32_t)c->bin<<16 | c->qual<<8 | c->l_qname;
    x[3] = (uint32_t)c->flag<<16 | c->n_cigar;
    x[4] = c->l_qseq;
    x[5] = c->mtid;
    x[6] = c->mpos;
    x[7] = c->isize;
    ok = (bgzf_flush_try(fp, 4 + block_len) >= 0);
    if (fp->is_be) {
        for (i = 0; i < 8; ++i) ed_swap_4p(x + i);
        y = block_len;
        if (ok) ok = (bgzf_write(fp, ed_swap_4p(&y), 4) >= 0);
        swap_data(c, b->l_data, b->data, 1);
    } else {
        if (ok) ok = (bgzf_write(fp, &block_len, 4) >= 0);
    }
    if (ok) ok = (bgzf_write(fp, x, 32) >= 0);
    if (ok) ok = (bgzf_write(fp, b->data, b->l_data) >= 0);
    if (fp->is_be) swap_data(c, b->l_data, b->data, 0);
    return ok? 4 + block_len : -1;
}